

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPFakeTransmitter::GetLocalIPList_DNS(RTPFakeTransmitter *this)

{
  size_t *psVar1;
  uint uVar2;
  hostent *phVar3;
  uint *puVar4;
  _List_node_base *p_Var5;
  long lVar6;
  char name [1024];
  char acStack_428 [1023];
  undefined1 local_29;
  
  gethostname(acStack_428,0x3ff);
  local_29 = 0;
  phVar3 = gethostbyname(acStack_428);
  if ((phVar3 != (hostent *)0x0) && (puVar4 = (uint *)*phVar3->h_addr_list, puVar4 != (uint *)0x0))
  {
    lVar6 = 8;
    do {
      uVar2 = *puVar4;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      *(uint *)&p_Var5[1]._M_next =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      puVar4 = *(uint **)((long)phVar3->h_addr_list + lVar6);
      lVar6 = lVar6 + 8;
    } while (puVar4 != (uint *)0x0);
  }
  return;
}

Assistant:

void RTPFakeTransmitter::GetLocalIPList_DNS()
{
	struct hostent *he;
	char name[1024];
	uint32_t ip;
	bool done;
	int i,j;

	gethostname(name,1023);
	name[1023] = 0;
	he = gethostbyname(name);
	if (he == 0)
		return;
	
	ip = 0;
	i = 0;
	done = false;
	while (!done)
	{
		if (he->h_addr_list[i] == NULL)
			done = true;
		else
		{
			ip = 0;
			for (j = 0 ; j < 4 ; j++)
				ip |= ((uint32_t)((unsigned char)he->h_addr_list[i][j])<<((3-j)*8));
			localIPs.push_back(ip);
			i++;
		}
	}
}